

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_insert(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,time_point now,
           time_point expire_time)

{
  duration *pdVar1;
  long lVar2;
  long lVar3;
  _List_iterator<unsigned_long> _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar5;
  unsigned_long element_idx;
  
  if ((ulong)(*(long *)(this + 0x40) - *(long *)(this + 0x38) >> 6) <= *(ulong *)(this + 0x30)) {
    do_prune(this,now);
  }
  element_idx = *(unsigned_long *)(*(long *)(this + 0xb8) + 0x10);
  pVar5 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long_const&,unsigned_long&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x50),key,&element_idx);
  std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((list<unsigned_long,std::allocator<unsigned_long>> *)(this + 0xa0),&element_idx);
  lVar2 = *(long *)(this + 0x38);
  lVar3 = element_idx * 0x40;
  pdVar1 = (duration *)(lVar2 + lVar3);
  std::__cxx11::string::operator=((string *)(pdVar1 + 4),(string *)value);
  pdVar1->__r = (rep)expire_time.__d.__r;
  pdVar1[2].__r = *(rep *)(this + 0xb8);
  _Var4 = std::prev<std::_List_iterator<unsigned_long>>((_List_node_base *)(this + 0xa0),1);
  pdVar1[3].__r = (rep)_Var4._M_node;
  pdVar1[1].__r =
       (rep)pVar5.first.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
  *(undefined8 *)(this + 0xb8) = **(undefined8 **)(this + 0xb8);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  do_access(this,(element *)(lVar2 + lVar3));
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }
        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        m_ttl_list.emplace_back(element_idx);

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = std::prev(m_ttl_list.end());
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }